

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c-html.c
# Opt level: O0

int leave_span_callback(MD_SPANTYPE type,void *detail,void *userdata)

{
  MD_CHAR *text;
  MD_HTML *in_RDX;
  MD_HTML *in_RSI;
  uint in_EDI;
  MD_HTML *r;
  
  if (in_EDI == 3) {
    in_RDX->image_nesting_level = in_RDX->image_nesting_level + -1;
  }
  if (in_RDX->image_nesting_level < 1) {
    text = (MD_CHAR *)(ulong)in_EDI;
    switch(text) {
    case (MD_CHAR *)0x0:
      render_verbatim(in_RDX,text,0);
      break;
    case (MD_CHAR *)0x1:
      render_verbatim(in_RDX,text,0);
      break;
    case (MD_CHAR *)0x2:
      render_verbatim(in_RDX,text,0);
      break;
    case (MD_CHAR *)0x3:
      render_close_img_span(in_RSI,(MD_SPAN_IMG_DETAIL *)in_RDX);
      break;
    case (MD_CHAR *)0x4:
      render_verbatim(in_RDX,text,0);
      break;
    case (MD_CHAR *)0x5:
      render_verbatim(in_RDX,text,0);
      break;
    case (MD_CHAR *)0x6:
    case (MD_CHAR *)0x7:
      render_verbatim(in_RDX,text,0);
      break;
    case (MD_CHAR *)0x8:
      render_verbatim(in_RDX,text,0);
      break;
    case (MD_CHAR *)0x9:
      render_verbatim(in_RDX,text,0);
    }
  }
  return 0;
}

Assistant:

static int
leave_span_callback(MD_SPANTYPE type, void* detail, void* userdata)
{
    MD_HTML* r = (MD_HTML*) userdata;

    if(type == MD_SPAN_IMG)
        r->image_nesting_level--;
    if(r->image_nesting_level > 0)
        return 0;

    switch(type) {
        case MD_SPAN_EM:                RENDER_VERBATIM(r, "</em>"); break;
        case MD_SPAN_STRONG:            RENDER_VERBATIM(r, "</strong>"); break;
        case MD_SPAN_U:                 RENDER_VERBATIM(r, "</u>"); break;
        case MD_SPAN_A:                 RENDER_VERBATIM(r, "</a>"); break;
        case MD_SPAN_IMG:               render_close_img_span(r, (MD_SPAN_IMG_DETAIL*) detail); break;
        case MD_SPAN_CODE:              RENDER_VERBATIM(r, "</code>"); break;
        case MD_SPAN_DEL:               RENDER_VERBATIM(r, "</del>"); break;
        case MD_SPAN_LATEXMATH:         /*fall through*/
        case MD_SPAN_LATEXMATH_DISPLAY: RENDER_VERBATIM(r, "</x-equation>"); break;
        case MD_SPAN_WIKILINK:          RENDER_VERBATIM(r, "</x-wikilink>"); break;
    }

    return 0;
}